

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

size_t fnet_socket_bind_all(fnet_sock_t sock_type,fnet_socket_t *ifaces,size_t size,int flags)

{
  int iVar1;
  uint in_ECX;
  ulong in_RDX;
  long in_RSI;
  int broadcast_enable;
  fnet_socket_t socket;
  size_t ifaces_num;
  ifaddrs *ifa;
  ifaddrs *ifaddr;
  undefined4 local_48;
  fnet_socket_t local_44;
  ulong uVar2;
  ulong uVar3;
  undefined8 *local_38;
  undefined8 *local_30;
  uint local_24;
  ulong local_20;
  long local_18;
  size_t local_8;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = getifaddrs(&local_30);
  if (iVar1 == -1) {
    local_8 = 0;
  }
  else {
    uVar2 = 0;
    local_38 = local_30;
    while ((local_38 != (undefined8 *)0x0 && (uVar2 < local_20))) {
      if ((local_38[3] != 0) &&
         ((*(short *)local_38[3] == 2 &&
          (local_44 = fnet_socket_create((fnet_sock_t)uVar2), local_44 != 0xffffffff)))) {
        uVar3 = uVar2;
        if ((local_24 & 1) != 0) {
          local_48 = 1;
          iVar1 = setsockopt(local_44,1,6,&local_48,4);
          uVar3 = uVar2;
          if (iVar1 < 0) {
            fnet_socket_close(0);
            goto LAB_001085a8;
          }
        }
        iVar1 = bind(local_44,(sockaddr *)local_38[3],0x10);
        if (iVar1 < 0) {
          fnet_socket_close(0);
          uVar2 = uVar3;
        }
        else {
          uVar2 = uVar3 + 1;
          *(fnet_socket_t *)(local_18 + uVar3 * 4) = local_44;
        }
      }
LAB_001085a8:
      local_38 = (undefined8 *)*local_38;
    }
    freeifaddrs(local_30);
    local_8 = uVar2;
  }
  return local_8;
}

Assistant:

size_t fnet_socket_bind_all(fnet_sock_t sock_type, fnet_socket_t *ifaces, size_t size, int flags)
{
    struct ifaddrs *ifaddr, *ifa;

    if (getifaddrs(&ifaddr) == -1)
    {
        FLOG_ERR("getifaddrs failed");
        return 0;
    }

    size_t ifaces_num = 0;

    for (ifa = ifaddr; ifa != NULL; ifa = ifa->ifa_next)
    {
        if (ifaces_num >= size)
            break;

        if (!ifa->ifa_addr)
            continue;

        if (ifa->ifa_addr->sa_family != AF_INET)
            continue;

        // create socket
        fnet_socket_t socket = fnet_socket_create(sock_type);
        if (socket == FNET_INVALID_SOCKET)
        {
            FLOG_ERR("Unable to create socket");
            continue;
        }

        // set flags
        if (flags & FNET_SOCK_BROADCAST)
        {
            int broadcast_enable = 1;
            if(setsockopt(socket, SOL_SOCKET, SO_BROADCAST, &broadcast_enable, sizeof(broadcast_enable)) < 0)
            {
                FLOG_ERR("broadcast options");
                fnet_socket_close(socket);
                continue;
            }
        }

        if (bind(socket, (struct sockaddr_in const *)ifa->ifa_addr, sizeof(struct sockaddr_in)) < 0)
        {
            FLOG_ERR("Socket bind error");
            fnet_socket_close(socket);
            continue;
        }

        // remember
        ifaces[ifaces_num++] = socket;
    }

    freeifaddrs(ifaddr);

    FLOG_INFO("Ifaces: %d\n", ifaces_num);

    return ifaces_num;
}